

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SIFT.cpp
# Opt level: O0

pair<double,_int> Min(vector<double,_std::allocator<double>_> *a)

{
  size_type sVar1;
  const_reference pvVar2;
  pair<double,_int> pVar3;
  int local_30;
  int local_2c;
  int i;
  int smIdx;
  double smallest;
  vector<double,_std::allocator<double>_> *a_local;
  undefined4 local_10;
  
  _i = 100000000.0;
  local_2c = 0;
  local_30 = 0;
  smallest = (double)a;
  while( true ) {
    sVar1 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)smallest);
    if (sVar1 <= (ulong)(long)local_30) break;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)smallest,(long)local_30);
    if (*pvVar2 < _i) {
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)smallest,(long)local_30);
      _i = *pvVar2;
      local_2c = local_30;
    }
    local_30 = local_30 + 1;
  }
  std::pair<double,_int>::pair<double_&,_int_&,_true>
            ((pair<double,_int> *)&a_local,(double *)&i,&local_2c);
  pVar3._12_4_ = 0;
  pVar3.first = (double)a_local;
  pVar3.second = local_10;
  return pVar3;
}

Assistant:

pair<double, int> Min(const vector<double>& a) {
    double smallest = 1e+8;
    int smIdx = 0;
    for(int i=0; i<a.size(); i++){
        if(a[i] < smallest){
            smallest = a[i];
            smIdx = i;
        }
    }
    return pair<double, int>(smallest, smIdx);
}